

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O1

bool __thiscall
aeron::archive::ArchiveProxy::replay
          (ArchiveProxy *this,int64_t recordingId,int64_t position,int64_t length,
          string *replayChannel,int32_t replayStreamId,int64_t correlationId,
          int64_t controlSessionId)

{
  bool bVar1;
  ReplayRequest *this_00;
  int32_t val_3;
  int64_t val_2;
  int64_t val_1;
  int64_t val;
  ReplayRequest local_68;
  
  local_68.m_offset = 0;
  local_68.m_buffer = (char *)0x0;
  local_68.m_bufferLength = 0;
  this_00 = wrapAndApplyHeader<io::aeron::archive::codecs::ReplayRequest>(this,&local_68);
  *(int64_t *)(this_00->m_buffer + this_00->m_offset) = controlSessionId;
  *(int64_t *)(this_00->m_buffer + this_00->m_offset + 8) = correlationId;
  *(int64_t *)(this_00->m_buffer + this_00->m_offset + 0x10) = recordingId;
  *(int64_t *)(this_00->m_buffer + this_00->m_offset + 0x18) = position;
  *(int64_t *)(this_00->m_buffer + this_00->m_offset + 0x20) = length;
  *(int32_t *)(this_00->m_buffer + this_00->m_offset + 0x28) = replayStreamId;
  io::aeron::archive::codecs::ReplayRequest::putReplayChannel(this_00,replayChannel);
  bVar1 = offer(this,(int)local_68.m_position - (int)local_68.m_offset);
  return bVar1;
}

Assistant:

bool ArchiveProxy::replay(std::int64_t recordingId, std::int64_t position, std::int64_t length,
                          const std::string& replayChannel, std::int32_t replayStreamId, std::int64_t correlationId,
                          std::int64_t controlSessionId) {
    codecs::ReplayRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .recordingId(recordingId)
        .position(position)
        .length(length)
        .replayStreamId(replayStreamId)
        .putReplayChannel(replayChannel);

    return offer(msg.encodedLength());
}